

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_operation.h
# Opt level: O0

void mocker::
     subSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *s,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *o)

{
  bool bVar1;
  _Node_iterator_base<unsigned_long,_false> local_48;
  _Node_iterator_base<unsigned_long,_false> local_40;
  iterator iter;
  value_type_conflict *v;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *o_local;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *s_local;
  
  __end0 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(o);
  v = (value_type_conflict *)
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::end(o);
  while (bVar1 = std::__detail::operator!=
                           (&__end0.super__Node_iterator_base<unsigned_long,_false>,
                            (_Node_iterator_base<unsigned_long,_false> *)&v), bVar1) {
    iter.super__Node_iterator_base<unsigned_long,_false>._M_cur =
         (_Node_iterator_base<unsigned_long,_false>)
         std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*(&__end0);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::find(s,(key_type *)iter.super__Node_iterator_base<unsigned_long,_false>._M_cur);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(s);
    bVar1 = std::__detail::operator!=(&local_40,&local_48);
    if (bVar1) {
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::erase(s,(iterator)local_40._M_cur);
    }
    std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end0);
  }
  return;
}

Assistant:

void subSet(Set &s, const Iterable &o) {
  for (auto &v : o) {
    auto iter = s.find(v);
    if (iter != s.end())
      s.erase(iter);
  }
}